

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int setuidgid_stub(expbuf_t *buf)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  void *pvVar5;
  int *piVar6;
  char *pcVar7;
  undefined8 uVar8;
  passwd *pw;
  passwd pwbuf;
  char pwstrbuf [65536];
  passwd *ppStack_10050;
  passwd pStack_10048;
  char acStack_10018 [65536];
  
  pcVar7 = buf->start;
  pcVar2 = buf->end;
  pvVar5 = memchr(pcVar7,0,(long)pcVar2 - (long)pcVar7);
  if (pvVar5 == (void *)0x0) {
LAB_0018a96f:
    setuidgid_stub_cold_1();
    return -1;
  }
  buf->start = (char *)((long)pvVar5 + 1);
  if ((pcVar7 == (char *)0x0) || ((ulong)((long)pcVar2 - ((long)pvVar5 + 1)) < 8))
  goto LAB_0018a96f;
  lVar3 = *(long *)((long)pvVar5 + 1);
  buf->start = (char *)((long)pvVar5 + 9);
  piVar6 = __errno_location();
  *piVar6 = 0;
  iVar4 = getpwnam_r(pcVar7,&pStack_10048,acStack_10018,0x10000,&ppStack_10050);
  if (iVar4 == 0) {
    if (ppStack_10050 == (passwd *)0x0) {
      warnf("%s: failed to obtain information of user:%s","setuidgid_stub",pcVar7);
    }
    else {
      if (lVar3 != 0) {
        iVar4 = chown(((daemon_vars.nb)->sun_).sun_path,ppStack_10050->pw_uid,ppStack_10050->pw_gid)
        ;
        pcVar7 = ((daemon_vars.nb)->sun_).sun_path;
        if (iVar4 != 0) {
LAB_0018aa3f:
          dief("chown failed for:%s",pcVar7);
        }
        pcVar7 = dirname(pcVar7);
        iVar4 = chown(pcVar7,ppStack_10050->pw_uid,ppStack_10050->pw_gid);
        if (iVar4 != 0) goto LAB_0018aa3f;
        free(pcVar7);
      }
      iVar4 = setgid(ppStack_10050->pw_gid);
      if (iVar4 == 0) {
        iVar4 = initgroups(ppStack_10050->pw_name,ppStack_10050->pw_gid);
        if (iVar4 != 0) {
          warnf("%s: initgroups(%s, %d) failed","setuidgid_stub",ppStack_10050->pw_name,
                (ulong)ppStack_10050->pw_gid);
          goto LAB_0018a9f5;
        }
        iVar4 = setuid(ppStack_10050->pw_uid);
        if (iVar4 == 0) {
          uVar8 = 0;
          goto LAB_0018a9fc;
        }
        uVar1 = ppStack_10050->pw_uid;
        pcVar7 = "%s: setuid(%d) failed\n";
      }
      else {
        uVar1 = ppStack_10050->pw_gid;
        pcVar7 = "%s: setgid(%d) failed";
      }
      warnf(pcVar7,"setuidgid_stub",(ulong)uVar1);
    }
  }
  else {
    warnf("%s: getpwnam_r failed","setuidgid_stub");
  }
LAB_0018a9f5:
  uVar8 = 0xffffffffffffffff;
LAB_0018a9fc:
  expbuf_dispose(buf);
  expbuf_reserve(buf,8);
  *(undefined8 *)buf->end = uVar8;
  buf->end = buf->end + 8;
  return 0;
}

Assistant:

static int setuidgid_stub(struct expbuf_t *buf)
{
    const char *user;
    size_t change_socket_ownership;
    struct passwd pwbuf, *pw;
    char pwstrbuf[65536]; /* should be large enough */
    int ret = -1;

    if ((user = expbuf_shift_str(buf)) == NULL || expbuf_shift_num(buf, &change_socket_ownership) != 0) {
        errno = 0;
        warnf("%s: failed to parse request", __FUNCTION__);
        return -1;
    }

    errno = 0;
    if (getpwnam_r(user, &pwbuf, pwstrbuf, sizeof(pwstrbuf), &pw) != 0) {
        warnf("%s: getpwnam_r failed", __FUNCTION__);
        goto Respond;
    }
    if (pw == NULL) {
        warnf("%s: failed to obtain information of user:%s", __FUNCTION__, user);
        goto Respond;
    }

    if (change_socket_ownership) {
        char *dir;
        if (chown(daemon_vars.nb->sun_.sun_path, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", daemon_vars.nb->sun_.sun_path);
        dir = dirname(daemon_vars.nb->sun_.sun_path);
        if (chown(dir, pw->pw_uid, pw->pw_gid) != 0)
            dief("chown failed for:%s", dir);
        free(dir);
    }

    /* setuidgid */
    if (setgid(pw->pw_gid) != 0) {
        warnf("%s: setgid(%d) failed", __FUNCTION__, (int)pw->pw_gid);
        goto Respond;
    }
    if (initgroups(pw->pw_name, pw->pw_gid) != 0) {
        warnf("%s: initgroups(%s, %d) failed", __FUNCTION__, pw->pw_name, (int)pw->pw_gid);
        goto Respond;
    }
    if (setuid(pw->pw_uid) != 0) {
        warnf("%s: setuid(%d) failed\n", __FUNCTION__, (int)pw->pw_uid);
        goto Respond;
    }
    ret = 0;

Respond:
    expbuf_dispose(buf);
    expbuf_push_num(buf, ret);
    return 0;
}